

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetRepeatedEnum
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index)

{
  int iVar1;
  LogMessage *pLVar2;
  EnumValueDescriptor *pEVar3;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnum","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnum",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedEnum",CPPTYPE_ENUM);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4ae);
      pLVar2 = LogMessage::operator<<(&local_a0,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar2);
      LogMessage::~LogMessage(&local_a0);
    }
    iVar1 = ExtensionSet::GetRepeatedEnum
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (long)this->extensions_offset_),*(int *)(field + 0x28),index);
  }
  else {
    iVar1 = this->offsets_
            [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
             -0x11111111];
    if (*(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + (long)iVar1) <= index) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                 ,0x265);
      pLVar2 = LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar2);
      LogMessage::~LogMessage(&local_a0);
    }
    iVar1 = *(int *)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1)
                    + (long)index * 4);
  }
  pEVar3 = EnumDescriptor::FindValueByNumber(*(EnumDescriptor **)(field + 0x50),iVar1);
  if (pEVar3 == (EnumValueDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
               ,0x3ad);
    pLVar2 = LogMessage::operator<<(&local_68,"CHECK failed: result != NULL: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Value ");
    pLVar2 = LogMessage::operator<<(pLVar2,iVar1);
    pLVar2 = LogMessage::operator<<(pLVar2," is not valid for field ");
    pLVar2 = LogMessage::operator<<(pLVar2,*(string **)(field + 8));
    pLVar2 = LogMessage::operator<<(pLVar2," of type ");
    pLVar2 = LogMessage::operator<<(pLVar2,*(string **)(*(long *)(field + 0x50) + 8));
    pLVar2 = LogMessage::operator<<(pLVar2,".");
    LogFinisher::operator=(&local_a1,pLVar2);
    LogMessage::~LogMessage(&local_68);
  }
  return pEVar3;
}

Assistant:

const EnumValueDescriptor* GeneratedMessageReflection::GetRepeatedEnum(
    const Message& message, const FieldDescriptor* field, int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnum, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  const EnumValueDescriptor* result =
    field->enum_type()->FindValueByNumber(value);
  GOOGLE_CHECK(result != NULL) << "Value " << value << " is not valid for field "
                        << field->full_name() << " of type "
                        << field->enum_type()->full_name() << ".";
  return result;
}